

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * __thiscall
flatbuffers::PosixPath_abi_cxx11_(string *__return_storage_ptr__,flatbuffers *this,char *path)

{
  char local_42 [2];
  char *local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  allocator<char> local_1a;
  undefined1 local_19;
  flatbuffers *local_18;
  char *path_local;
  string *p;
  
  local_19 = 0;
  local_18 = this;
  path_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)this,&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  local_38._M_current = (char *)std::__cxx11::string::begin();
  local_40 = (char *)std::__cxx11::string::end();
  local_42[1] = 0x5c;
  local_42[0] = '/';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_38,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_40,local_42 + 1,local_42);
  return __return_storage_ptr__;
}

Assistant:

std::string PosixPath(const char *path) {
  std::string p = path;
  std::replace(p.begin(), p.end(), '\\', '/');
  return p;
}